

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O2

void SVRG::save_load(svrg *s,io_buf *model_file,bool read,bool text)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  bool resume;
  stringstream msg;
  ostream local_1a0;
  
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(s->all);
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    resume = s->all->save_resume;
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(&local_1a0,":");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
    bin_text_read_write_fixed(model_file,&resume,1,"",read,&msg,text);
    if (resume == true) {
      GD::save_load_online_state(s->all,model_file,read,text,(gd *)0x0);
    }
    else {
      GD::save_load_regressor(s->all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load(svrg& s, io_buf& model_file, bool read, bool text)
{
  if (read)
  {
    initialize_regressor(*s.all);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = s.all->save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);

    if (resume)
      GD::save_load_online_state(*s.all, model_file, read, text);
    else
      GD::save_load_regressor(*s.all, model_file, read, text);
  }
}